

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Bot.cpp
# Opt level: O1

void __thiscall
IRC_Bot::setCommandAccessLevels::anon_class_16_2_306f8aac::operator()
          (anon_class_16_2_306f8aac *this,Config *in_section)

{
  IRC_Bot *this_00;
  size_t __n;
  void *__s;
  char *pcVar1;
  int iVar2;
  int accessLevel;
  long lVar3;
  void *pvVar4;
  size_t sVar5;
  IRCCommand *pIVar6;
  undefined8 *puVar7;
  ulong uVar8;
  size_t sVar9;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_prefix;
  basic_string_view<char,_std::char_traits<char>_> in_prefix_00;
  string_view trigger;
  string_view trigger_00;
  string_view trigger_01;
  string_view channel;
  
  if (in_section != (Config *)0x0) {
    this_00 = this->this;
    lVar3 = Jupiter::Config::getSection(in_section,8,"Commands");
    if (lVar3 != 0) {
      for (puVar7 = *(undefined8 **)(lVar3 + 0x38); puVar7 != (undefined8 *)0x0;
          puVar7 = (undefined8 *)*puVar7) {
        __n = puVar7[2];
        if (__n == 0) {
          uVar8 = 0xffffffffffffffff;
        }
        else {
          __s = (void *)puVar7[1];
          pvVar4 = memchr(__s,0x2e,__n);
          uVar8 = -(ulong)(pvVar4 == (void *)0x0) | (long)pvVar4 - (long)__s;
        }
        pcVar1 = (char *)puVar7[1];
        if (uVar8 == 0xffffffffffffffff) {
          trigger_00._M_str = pcVar1;
          trigger_00._M_len = __n;
          pIVar6 = getCommand(this_00,trigger_00);
          if ((pIVar6 != (IRCCommand *)0x0) &&
             ((this->in_command == (IRCCommand *)0x0 || (this->in_command == pIVar6)))) {
            iVar2 = Jupiter_strtoi_s(puVar7[5],puVar7[6],0);
            IRCCommand::setAccessLevel(pIVar6,iVar2);
          }
        }
        else {
          sVar9 = __n - (uVar8 + 1);
          in_string._M_str = pcVar1 + uVar8 + 1;
          in_string._M_len = sVar9;
          in_prefix._M_str = "Type.";
          in_prefix._M_len = 5;
          sVar5 = jessilib::starts_with_lengthi<char,char>(in_string,in_prefix);
          if (sVar5 == 0) {
            in_string_00._M_str = pcVar1 + uVar8 + 1;
            in_string_00._M_len = sVar9;
            in_prefix_00._M_str = "Channel.";
            in_prefix_00._M_len = 8;
            sVar5 = jessilib::starts_with_lengthi<char,char>(in_string_00,in_prefix_00);
            if (sVar5 != 0) {
              trigger_01._M_str = pcVar1;
              trigger_01._M_len = uVar8;
              pIVar6 = getCommand(this_00,trigger_01);
              if ((pIVar6 != (IRCCommand *)0x0) &&
                 ((this->in_command == (IRCCommand *)0x0 || (this->in_command == pIVar6)))) {
                iVar2 = Jupiter_strtoi_s(puVar7[5],puVar7[6],0);
                channel._M_str = pcVar1 + uVar8 + 9;
                channel._M_len = sVar9 - 8;
                IRCCommand::setAccessLevel(pIVar6,channel,iVar2);
              }
            }
          }
          else {
            trigger._M_str = pcVar1;
            trigger._M_len = uVar8;
            pIVar6 = getCommand(this_00,trigger);
            if ((pIVar6 != (IRCCommand *)0x0) &&
               ((this->in_command == (IRCCommand *)0x0 || (this->in_command == pIVar6)))) {
              iVar2 = Jupiter_strtoi_s(pcVar1 + uVar8 + 6,sVar9 - 5,0);
              accessLevel = Jupiter_strtoi_s(puVar7[5],puVar7[6],0);
              IRCCommand::setAccessLevel(pIVar6,iVar2,accessLevel);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void IRC_Bot::setCommandAccessLevels(IRCCommand *in_command) {
	auto set_command_access_levels = [this, in_command](Jupiter::Config *in_section) {
		if (in_section == nullptr) {
			return;
		}

		Jupiter::Config *section = in_section->getSection("Commands"sv);
		if (section == nullptr) {
			return;
		}

		for (auto& entry : section->getTable()) {
			size_t tmp_index;
			std::string_view tmp_key, tmp_sub_key;
			IRCCommand *command;

			tmp_index = entry.first.find('.');
			if (tmp_index != std::string_view::npos) {
				// non-default access assignment

				tmp_key = std::string_view(entry.first.data(), tmp_index);

				tmp_sub_key = entry.first;
				tmp_sub_key.remove_prefix(tmp_index + 1);

				if (jessilib::starts_withi(tmp_sub_key, "Type."sv)) {
					tmp_sub_key.remove_prefix(5); // strip "Type."

					command = this->getCommand(tmp_key);
					if (command != nullptr && (in_command == nullptr || in_command == command)) {
						command->setAccessLevel(Jupiter::from_string<int>(tmp_sub_key), Jupiter::from_string<int>(entry.second));
					}
				}
				else if (jessilib::starts_withi(tmp_sub_key, "Channel."sv)) {
					tmp_sub_key.remove_prefix(8); // strip "Channel."

					// Assign access level to command (if command exists)
					command = this->getCommand(tmp_key);
					if (command != nullptr && (in_command == nullptr || in_command == command))
						command->setAccessLevel(tmp_sub_key, Jupiter::from_string<int>(entry.second));
				}
			}
			else {
				// Assign access level to command (if command exists)
				command = this->getCommand(entry.first);
				if (command != nullptr && (in_command == nullptr || in_command == command))
					command->setAccessLevel(Jupiter::from_string<int>(entry.second));
			}
		};
	};

	set_command_access_levels(getSecondaryConfigSection());
	set_command_access_levels(getPrimaryConfigSection());
}